

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_avx512.c
# Opt level: O3

uint32_t adler32_avx512(uint32_t adler,uint8_t *src,size_t len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  
  if (src == (uint8_t *)0x0) {
    adler = 1;
  }
  else if (len != 0) {
    if (0x3f < len) {
      uVar5 = adler & 0xffff;
      uVar4 = adler >> 0x10;
      auVar9 = vmovdqa64_avx512f(_DAT_0011cb00);
      auVar10 = vpbroadcastw_avx512bw(ZEXT216(1));
      do {
        uVar6 = 0x15b0;
        if (len < 0x15b0) {
          uVar6 = len;
        }
        auVar14 = ZEXT464(uVar5);
        auVar13 = ZEXT464(uVar4);
        if ((uVar6 & 0x1fc0) == 0) {
          auVar15 = ZEXT1664((undefined1  [16])0x0);
        }
        else {
          lVar7 = -(uVar6 & 0xffffffffffffffc0);
          auVar15 = ZEXT1664((undefined1  [16])0x0);
          do {
            auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])src);
            src = (uint8_t *)((long)src + 0x40);
            auVar12 = vpsadbw_avx512bw(auVar11,ZEXT1664((undefined1  [16])0x0));
            auVar11 = vpmaddubsw_avx512bw(auVar11,auVar9);
            auVar11 = vpmaddwd_avx512bw(auVar11,auVar10);
            auVar13 = vpaddd_avx512f(auVar11,auVar13);
            auVar15 = vpaddd_avx512f(auVar15,auVar14);
            auVar14 = vpaddd_avx512f(auVar14,auVar12);
            lVar7 = lVar7 + 0x40;
          } while (lVar7 != 0);
          auVar15 = vpslld_avx512f(auVar15,6);
        }
        auVar13 = vpaddd_avx512f(auVar13,auVar15);
        auVar8 = vpmovqd_avx512f(auVar14);
        auVar1 = vpaddd_avx(auVar8._16_16_,auVar8._0_16_);
        auVar1 = vphaddd_avx(auVar1,auVar1);
        len = len - ((uint)uVar6 & 0x1fc0);
        auVar1 = vphaddd_avx(auVar1,auVar1);
        uVar5 = auVar1._0_4_ % 0xfff1;
        auVar8 = vextracti64x4_avx512f(auVar13,1);
        auVar8 = vpaddd_avx2(auVar8,auVar13._0_32_);
        auVar1 = vpaddd_avx(auVar8._16_16_,auVar8._0_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        auVar1 = vphaddd_avx(auVar1,auVar1);
        uVar4 = auVar1._0_4_ % 0xfff1;
      } while (0x3f < len);
      adler = uVar4 << 0x10 | uVar5;
      if (len == 0) {
        return adler;
      }
    }
    uVar3 = adler32_avx2(adler,src,len);
    return uVar3;
  }
  return adler;
}

Assistant:

static inline uint32_t adler32_fold_copy_impl(uint32_t adler, uint8_t *dst, const uint8_t *src, size_t len, const int COPY) {
    if (src == NULL) return 1L;
    if (len == 0) return adler;

    uint32_t adler0, adler1;
    adler1 = (adler >> 16) & 0xffff;
    adler0 = adler & 0xffff;

rem_peel:
    if (len < 64) {
        /* This handles the remaining copies, just call normal adler checksum after this */
        if (COPY) {
            __mmask64 storemask = (0xFFFFFFFFFFFFFFFFUL >> (64 - len));
            __m512i copy_vec = _mm512_maskz_loadu_epi8(storemask, src);
            _mm512_mask_storeu_epi8(dst, storemask, copy_vec);
        }

        return adler32_avx2(adler, src, len);
    }

    __m512i vbuf, vs1_0, vs3;

    const __m512i dot2v = _mm512_set_epi8(1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19,
                                          20, 21, 22, 23, 24, 25, 26, 27, 28, 29, 30, 31, 32, 33, 34, 35, 36, 37,
                                          38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48, 49, 50, 51, 52, 53, 54, 55,
                                          56, 57, 58, 59, 60, 61, 62, 63, 64);
    const __m512i dot3v = _mm512_set1_epi16(1);
    const __m512i zero = _mm512_setzero_si512();
    size_t k;

    while (len >= 64) {
        __m512i vs1 = _mm512_zextsi128_si512(_mm_cvtsi32_si128(adler0));
        __m512i vs2 = _mm512_zextsi128_si512(_mm_cvtsi32_si128(adler1));
        vs1_0 = vs1;
        vs3 = _mm512_setzero_si512();

        k = MIN(len, NMAX);
        k -= k % 64;
        len -= k;

        while (k >= 64) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 64 vs1 + sum( (64-i+1) c[i] )
            */
            vbuf = _mm512_loadu_si512(src);

            if (COPY) {
                _mm512_storeu_si512(dst, vbuf);
                dst += 64;
            }

            src += 64;
            k -= 64;

            __m512i vs1_sad = _mm512_sad_epu8(vbuf, zero);
            __m512i v_short_sum2 = _mm512_maddubs_epi16(vbuf, dot2v);
            vs1 = _mm512_add_epi32(vs1_sad, vs1);
            vs3 = _mm512_add_epi32(vs3, vs1_0);
            __m512i vsum2 = _mm512_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm512_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        vs3 = _mm512_slli_epi32(vs3, 6);
        vs2 = _mm512_add_epi32(vs2, vs3);

        adler0 = partial_hsum(vs1) % BASE;
        adler1 = _mm512_reduce_add_epu32(vs2) % BASE;
    }

    adler = adler0 | (adler1 << 16);

    /* Process tail (len < 64). */
    if (len) {
        goto rem_peel;
    }

    return adler;
}